

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::cleanup
          (SmallVectorBase<slang::Diagnostic> *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  pointer __location;
  
  if (this->len != 0) {
    __location = this->data_;
    lVar1 = this->len * 0x70;
    do {
      std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                ((__destroy_at_fn *)&std::ranges::destroy_at,__location);
      __location = __location + 1;
      lVar1 = lVar1 + -0x70;
    } while (lVar1 != 0);
  }
  if (this->data_ != (pointer)this->firstElement) {
    operator_delete(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }